

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
     PrintValue<pstore::extent<char>,void,std::ostream&>(extent<char> *value,ostream *os)

{
  ostream *os_local;
  extent<char> *value_local;
  
  pstore::operator<<(os,value);
  return;
}

Assistant:

static void PrintValue(const T& value, ::std::ostream* os) {
    // Call streaming operator found by ADL, possibly with implicit conversions
    // of the arguments.
    *os << value;
  }